

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-slab-alloc.c
# Opt level: O0

void * ztslaballoc(size_t n,void *opaque)

{
  long lVar1;
  ulong __size;
  void *pvVar2;
  long *in_RSI;
  long in_RDI;
  void **newlist;
  size_t alloced;
  void *newslab;
  char *p;
  ztslaballoc_t *sa;
  long local_38;
  void *local_8;
  
  __size = in_RDI + 7U & 0xfffffffffffffff8;
  if (__size < 4000) {
    if ((ulong)in_RSI[3] < __size) {
      if (in_RSI[1] == in_RSI[2]) {
        local_38 = in_RSI[2] << 1;
        if (local_38 == 0) {
          local_38 = 4;
        }
        pvVar2 = realloc((void *)*in_RSI,local_38 << 3);
        if (pvVar2 == (void *)0x0) {
          return (void *)0x0;
        }
        *in_RSI = (long)pvVar2;
        in_RSI[2] = local_38;
      }
      pvVar2 = malloc(4000);
      if (pvVar2 == (void *)0x0) {
        return (void *)0x0;
      }
      lVar1 = in_RSI[1];
      in_RSI[1] = lVar1 + 1;
      *(void **)(*in_RSI + lVar1 * 8) = pvVar2;
      in_RSI[3] = 4000;
    }
    local_8 = (void *)((4000 - in_RSI[3]) + *(long *)(*in_RSI + (in_RSI[1] + -1) * 8));
    in_RSI[3] = in_RSI[3] - __size;
    in_RSI[4] = in_RSI[4] + 1;
    in_RSI[5] = in_RSI[5] + 1;
    in_RSI[6] = __size + in_RSI[6];
  }
  else {
    local_8 = malloc(__size);
  }
  return local_8;
}

Assistant:

void *ztslaballoc(size_t n, void *opaque)
{
  ztslaballoc_t *sa = opaque;
  char          *p;

  /* round block sizes up to multiple of SLAB_ALIGN */
  n = (n + SLAB_ALIGN - 1) & ~(SLAB_ALIGN - 1);

  if (n >= SLAB_SIZE)
    return malloc(n);

  if (sa->remaining < n)
  {
    void *newslab;

    if (sa->nslablistused == sa->nslablistalloced)
    {
      size_t alloced;
      void **newlist;

      alloced = sa->nslablistalloced * 2; /* doubling strategy */
      if (alloced <= 0)
        alloced = 4;
      newlist = realloc(sa->slablist, alloced * sizeof(*newlist));
      if (newlist == NULL)
        return NULL;

      sa->slablist         = newlist;
      sa->nslablistalloced = alloced;
    }

    newslab = malloc(SLAB_SIZE);
    if (newslab == NULL)
      return NULL;

    sa->slablist[sa->nslablistused++] = newslab;

    sa->remaining = SLAB_SIZE;
  }

  p = sa->slablist[sa->nslablistused - 1];
  p += SLAB_SIZE - sa->remaining;
  sa->remaining -= n;

  sa->total_allocs++;
  sa->current_allocs++;
  sa->total_allocated += n;

  return p;
}